

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_or(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  TCGContext_conflict10 *pTVar2;
  TCGv_i64 pTVar3;
  byte bVar4;
  uint uVar5;
  uintptr_t o;
  TCGTemp *ts;
  TCGv_i32 pTVar6;
  uintptr_t o_2;
  uintptr_t o_1;
  uint uVar7;
  TCGv_i64 pTVar8;
  uint uVar9;
  int64_t arg2;
  bool bVar10;
  
  pTVar2 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar7 = uVar1 >> 0x15 & 0x1f;
  uVar9 = uVar1 >> 0x10 & 0x1f;
  uVar5 = uVar1 >> 0xb & 0x1f;
  if (uVar7 != uVar5 || uVar7 != uVar9) {
    pTVar8 = cpu_gpr[uVar9];
    pTVar3 = cpu_gpr[uVar7];
    if (uVar7 == uVar5) {
      if (pTVar8 != pTVar3) {
        tcg_gen_op2_ppc64(pTVar2,INDEX_op_mov_i64,(TCGArg)((long)&pTVar2->pool_cur + (long)pTVar8),
                          (TCGArg)((long)&pTVar2->pool_cur + (long)pTVar3));
      }
    }
    else {
      tcg_gen_op3_ppc64(pTVar2,INDEX_op_or_i64,(TCGArg)((long)&pTVar2->pool_cur + (long)pTVar8),
                        (TCGArg)((long)&pTVar2->pool_cur + (long)pTVar3),
                        (TCGArg)((long)&pTVar2->pool_cur + (long)cpu_gpr[uVar5]));
    }
    if ((ctx->opcode & 1) == 0) {
      return;
    }
    pTVar8 = cpu_gpr[uVar9];
LAB_00b91476:
    gen_set_Rc0(ctx,pTVar8);
    return;
  }
  if ((uVar1 & 1) != 0) {
    pTVar8 = cpu_gpr[uVar7];
    goto LAB_00b91476;
  }
  if (uVar7 == 0) {
    return;
  }
  bVar4 = 1;
  arg2 = 0;
  switch(uVar7) {
  case 1:
    arg2 = 0x8000000000000;
    break;
  case 2:
    arg2 = 0x10000000000000;
    break;
  case 3:
    bVar4 = ctx->pr;
    bVar10 = (_Bool)bVar4 == false;
    arg2 = 0x18000000000000;
    goto LAB_00b91347;
  case 4:
    goto switchD_00b91284_caseD_4;
  case 5:
    bVar4 = ctx->pr;
    bVar10 = (_Bool)bVar4 == false;
    arg2 = 0x14000000000000;
    goto LAB_00b91347;
  case 6:
    arg2 = 0xc000000000000;
    break;
  case 7:
    if (ctx->hv != true) {
      arg2 = 0;
      goto switchD_00b91284_caseD_4;
    }
    bVar4 = ctx->pr;
    bVar10 = (_Bool)bVar4 == false;
    arg2 = 0x1c000000000000;
LAB_00b91347:
    if (!bVar10) {
      arg2 = 0;
    }
    goto switchD_00b91284_caseD_4;
  default:
    if (uVar7 == 0x1f) {
      bVar4 = ctx->pr;
      arg2 = (ulong)(bVar4 ^ 1) << 0x32;
    }
    goto switchD_00b91284_caseD_4;
  }
  bVar4 = 0;
switchD_00b91284_caseD_4:
  if (bVar4 == 0) {
    ts = tcg_temp_new_internal_ppc64(pTVar2,TCG_TYPE_I64,false);
    pTVar8 = (TCGv_i64)((long)ts - (long)pTVar2);
    tcg_gen_op3_ppc64(pTVar2,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(pTVar2->cpu_env + (long)pTVar2),
                      0x2718);
    tcg_gen_andi_i64_ppc64(pTVar2,pTVar8,pTVar8,-0x1c000000000001);
    tcg_gen_ori_i64_ppc64(pTVar2,pTVar8,pTVar8,arg2);
    tcg_gen_op3_ppc64(pTVar2,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(pTVar2->cpu_env + (long)pTVar2),
                      0x2718);
    tcg_temp_free_internal_ppc64(pTVar2,ts);
  }
  pTVar2 = ctx->uc->tcg_ctx;
  pTVar6 = tcg_const_i32_ppc64(pTVar2,0);
  tcg_gen_op3_ppc64(pTVar2,INDEX_op_st_i32,(TCGArg)(pTVar6 + (long)pTVar2),
                    (TCGArg)(pTVar2->cpu_env + (long)pTVar2),0xffffffffffffe3d8);
  tcg_temp_free_internal_ppc64(pTVar2,(TCGTemp *)(pTVar6 + (long)pTVar2));
  gen_exception_nip(ctx,0x10001,(ctx->base).pc_next);
  return;
}

Assistant:

static void gen_or(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rs, ra, rb;

    rs = rS(ctx->opcode);
    ra = rA(ctx->opcode);
    rb = rB(ctx->opcode);
    /* Optimisation for mr. ri case */
    if (rs != ra || rs != rb) {
        if (rs != rb) {
            tcg_gen_or_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rs], cpu_gpr[rb]);
        } else {
            tcg_gen_mov_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rs]);
        }
        if (unlikely(Rc(ctx->opcode) != 0)) {
            gen_set_Rc0(ctx, cpu_gpr[ra]);
        }
    } else if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rs]);
#if defined(TARGET_PPC64)
    } else if (rs != 0) { /* 0 is nop */
        int prio = 0;

        switch (rs) {
        case 1:
            /* Set process priority to low */
            prio = 2;
            break;
        case 6:
            /* Set process priority to medium-low */
            prio = 3;
            break;
        case 2:
            /* Set process priority to normal */
            prio = 4;
            break;
        case 31:
            if (!ctx->pr) {
                /* Set process priority to very low */
                prio = 1;
            }
            break;
        case 5:
            if (!ctx->pr) {
                /* Set process priority to medium-hight */
                prio = 5;
            }
            break;
        case 3:
            if (!ctx->pr) {
                /* Set process priority to high */
                prio = 6;
            }
            break;
        case 7:
            if (ctx->hv && !ctx->pr) {
                /* Set process priority to very high */
                prio = 7;
            }
            break;
        default:
            break;
        }
        if (prio) {
            TCGv t0 = tcg_temp_new(tcg_ctx);
            gen_load_spr(tcg_ctx, t0, SPR_PPR);
            tcg_gen_andi_tl(tcg_ctx, t0, t0, ~0x001C000000000000ULL);
            tcg_gen_ori_tl(tcg_ctx, t0, t0, ((uint64_t)prio) << 50);
            gen_store_spr(tcg_ctx, SPR_PPR, t0);
            tcg_temp_free(tcg_ctx, t0);
        }
        /*
         * Pause out of TCG otherwise spin loops with smt_low eat too
         * much CPU and the kernel hangs.  This applies to all
         * encodings other than no-op, e.g., miso(rs=26), yield(27),
         * mdoio(29), mdoom(30), and all currently undefined.
         */
        gen_pause(ctx);
#endif
    }
}